

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncError asciiToAscii(void *vctxt,uchar *out,int *poutlen,uchar *in,int *pinlen,int flush)

{
  int iVar1;
  xmlCharEncError local_5c;
  uint c;
  int ret;
  int outlen;
  int inlen;
  uchar *instart;
  uchar *inend;
  int flush_local;
  int *pinlen_local;
  uchar *in_local;
  int *poutlen_local;
  uchar *out_local;
  void *vctxt_local;
  
  if (in == (uchar *)0x0) {
    *pinlen = 0;
    *poutlen = 0;
    vctxt_local._4_4_ = XML_ENC_ERR_SUCCESS;
  }
  else {
    local_5c = *pinlen;
    ret = local_5c;
    if (*poutlen < local_5c) {
      local_5c = XML_ENC_ERR_SPACE;
      ret = *poutlen;
    }
    *poutlen = ret;
    *pinlen = ret;
    pinlen_local = (int *)in;
    poutlen_local = (int *)out;
    while (pinlen_local < in + ret) {
      iVar1 = *pinlen_local;
      if (0x7f < (byte)iVar1) {
        *poutlen = (int)pinlen_local - (int)in;
        *pinlen = (int)pinlen_local - (int)in;
        return XML_ENC_ERR_INPUT;
      }
      pinlen_local = (int *)((long)pinlen_local + 1);
      *(byte *)poutlen_local = (byte)iVar1;
      poutlen_local = (int *)((long)poutlen_local + 1);
    }
    vctxt_local._4_4_ = local_5c;
  }
  return vctxt_local._4_4_;
}

Assistant:

static xmlCharEncError
asciiToAscii(void *vctxt ATTRIBUTE_UNUSED,
             unsigned char* out, int *poutlen,
             const unsigned char* in, int *pinlen,
             int flush ATTRIBUTE_UNUSED) {
    const unsigned char *inend;
    const unsigned char *instart = in;
    int inlen, outlen, ret;

    if (in == NULL) {
        *pinlen = 0;
        *poutlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    inlen = *pinlen;
    outlen = *poutlen;

    if (outlen < inlen) {
        inlen = outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
        ret = inlen;
    }

    inend = in + inlen;
    *poutlen = inlen;
    *pinlen = inlen;

    while (in < inend) {
	unsigned c = *in;

        if (c >= 0x80) {
	    *poutlen = in - instart;
	    *pinlen = in - instart;
	    return(XML_ENC_ERR_INPUT);
	}

        in++;
	*out++ = c;
    }

    return(ret);
}